

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *s)

{
  char *pcVar1;
  
  s->_M_string_length = 0;
  *(s->_M_dataplus)._M_p = '\0';
  if ((long)size <= (long)(this->buffer_end_ + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)s);
  }
  pcVar1 = AppendStringFallback(this,ptr,size,s);
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* s) {
  s->clear();
  // TODO(gerbens) assess security. At the moment its parity with
  // CodedInputStream but it allows a payload to reserve large memory.
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    s->reserve(size);
  }
  return AppendStringFallback(ptr, size, s);
}